

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaAigerExt.c
# Opt level: O0

uchar * Gia_WriteEquivClassesInt(Gia_Man_t *p,int *pEquivSize)

{
  int iVar1;
  uint uVar2;
  uchar *pBuffer_00;
  int local_3c;
  int local_38;
  int iPos;
  int nItems;
  int iLit;
  int iPrevNode;
  int iPrevRepr;
  int iNode;
  int iRepr;
  uchar *pBuffer;
  int *pEquivSize_local;
  Gia_Man_t *p_local;
  
  if ((p->pReprs != (Gia_Rpr_t *)0x0) && (p->pNexts != (int *)0x0)) {
    local_38 = 0;
    iPrevRepr = 1;
    do {
      iVar1 = Gia_ManObjNum(p);
      if (iVar1 <= iPrevRepr) {
        pBuffer_00 = (uchar *)malloc((long)(local_38 + 10) << 2);
        uVar2 = Abc_Var2Lit(0,1);
        local_3c = Gia_AigerWriteUnsignedBuffer(pBuffer_00,4,uVar2);
        nItems = 0;
        for (iPrevNode = 1; iVar1 = Gia_ManObjNum(p), iPrevNode < iVar1; iPrevNode = iPrevNode + 1)
        {
          iVar1 = Gia_ObjIsConst(p,iPrevNode);
          if (iVar1 != 0) {
            iVar1 = Gia_ObjProved(p,iPrevNode);
            iVar1 = Abc_Var2Lit(iPrevNode - nItems,iVar1);
            nItems = iPrevNode;
            uVar2 = Abc_Var2Lit(iVar1,0);
            local_3c = Gia_AigerWriteUnsignedBuffer(pBuffer_00,local_3c,uVar2);
          }
        }
        iLit = 0;
        iPrevRepr = 1;
        do {
          iVar1 = Gia_ManObjNum(p);
          if (iVar1 <= iPrevRepr) {
            Gia_AigerWriteInt(pBuffer_00,local_3c);
            *pEquivSize = local_3c;
            return pBuffer_00;
          }
          iVar1 = Gia_ObjIsHead(p,iPrevRepr);
          if (iVar1 != 0) {
            uVar2 = Abc_Var2Lit(iPrevRepr - iLit,1);
            local_3c = Gia_AigerWriteUnsignedBuffer(pBuffer_00,local_3c,uVar2);
            nItems = iPrevRepr;
            iLit = iPrevRepr;
            iVar1 = Gia_ObjIsHead(p,iPrevRepr);
            if (iVar1 == 0) {
              __assert_fail("Gia_ObjIsHead(p, iRepr)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaAigerExt.c"
                            ,0x6b,"unsigned char *Gia_WriteEquivClassesInt(Gia_Man_t *, int *)");
            }
            for (iPrevNode = Gia_ObjNext(p,iPrevRepr); 0 < iPrevNode;
                iPrevNode = Gia_ObjNext(p,iPrevNode)) {
              iVar1 = Gia_ObjProved(p,iPrevNode);
              iVar1 = Abc_Var2Lit(iPrevNode - nItems,iVar1);
              nItems = iPrevNode;
              uVar2 = Abc_Var2Lit(iVar1,0);
              local_3c = Gia_AigerWriteUnsignedBuffer(pBuffer_00,local_3c,uVar2);
            }
          }
          iPrevRepr = iPrevRepr + 1;
        } while( true );
      }
      iVar1 = Gia_ObjIsConst(p,iPrevRepr);
      local_38 = iVar1 + local_38;
      iVar1 = Gia_ObjIsHead(p,iPrevRepr);
      if (iVar1 != 0) {
        iVar1 = Gia_ObjIsHead(p,iPrevRepr);
        if (iVar1 == 0) {
          __assert_fail("Gia_ObjIsHead(p, iRepr)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaAigerExt.c"
                        ,0x57,"unsigned char *Gia_WriteEquivClassesInt(Gia_Man_t *, int *)");
        }
        for (iPrevNode = iPrevRepr; 0 < iPrevNode; iPrevNode = Gia_ObjNext(p,iPrevNode)) {
          local_38 = local_38 + 1;
        }
      }
      iPrevRepr = iPrevRepr + 1;
    } while( true );
  }
  __assert_fail("p->pReprs && p->pNexts",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaAigerExt.c"
                ,0x4f,"unsigned char *Gia_WriteEquivClassesInt(Gia_Man_t *, int *)");
}

Assistant:

unsigned char * Gia_WriteEquivClassesInt( Gia_Man_t * p, int * pEquivSize )
{
    unsigned char * pBuffer;
    int iRepr, iNode, iPrevRepr, iPrevNode, iLit, nItems, iPos;
    assert( p->pReprs && p->pNexts );
    // count the number of entries to be written
    nItems = 0;
    for ( iRepr = 1; iRepr < Gia_ManObjNum(p); iRepr++ )
    {
        nItems += Gia_ObjIsConst( p, iRepr );
        if ( !Gia_ObjIsHead(p, iRepr) )
            continue;
        Gia_ClassForEachObj( p, iRepr, iNode )
            nItems++;
    }
    pBuffer = ABC_ALLOC( unsigned char, sizeof(int) * (nItems + 10) );
    // write constant class
    iPos = Gia_AigerWriteUnsignedBuffer( pBuffer, 4, Abc_Var2Lit(0, 1) );
    iPrevNode = 0;
    for ( iNode = 1; iNode < Gia_ManObjNum(p); iNode++ )
        if ( Gia_ObjIsConst(p, iNode) )
        {
            iLit = Abc_Var2Lit( iNode - iPrevNode, Gia_ObjProved(p, iNode) );
            iPrevNode = iNode;
            iPos = Gia_AigerWriteUnsignedBuffer( pBuffer, iPos, Abc_Var2Lit(iLit, 0) );
        }
    // write non-constant classes
    iPrevRepr = 0;
    Gia_ManForEachClass( p, iRepr )
    {
        iPos = Gia_AigerWriteUnsignedBuffer( pBuffer, iPos, Abc_Var2Lit(iRepr - iPrevRepr, 1) );
        iPrevRepr = iPrevNode = iRepr;
        Gia_ClassForEachObj1( p, iRepr, iNode )
        {
            iLit = Abc_Var2Lit( iNode - iPrevNode, Gia_ObjProved(p, iNode) );
            iPrevNode = iNode;
            iPos = Gia_AigerWriteUnsignedBuffer( pBuffer, iPos, Abc_Var2Lit(iLit, 0) );
        }
    }
    Gia_AigerWriteInt( pBuffer, iPos );
    *pEquivSize = iPos;
    return pBuffer;
}